

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxlib.c
# Opt level: O1

int is_numeric(char *input)

{
  int iVar1;
  char *__string;
  size_t sVar2;
  uint uVar3;
  undefined1 local_78 [8];
  regex_t regex;
  regmatch_t pmatch [3];
  
  iVar1 = regcomp((regex_t *)local_78,"[+-]?[0-9]\\.?[0-9]*(e[+-]?[0-9]+)?",7);
  uVar3 = 0;
  if (iVar1 == 0) {
    __string = deblank(input);
    uVar3 = 0;
    iVar1 = regexec((regex_t *)local_78,__string,3,(regmatch_t *)&regex.field_0x38,0);
    if (iVar1 == 0) {
      sVar2 = strlen(__string);
      uVar3 = (uint)(sVar2 == (long)(int)regex._60_4_ - (long)(int)regex._56_4_);
      regfree((regex_t *)local_78);
      free(__string);
    }
  }
  return uVar3;
}

Assistant:

int 
is_numeric(const char* input) 
{
	int rv;
	int result;
	char* deb = (char*)NULL;
	regex_t regex;
	regmatch_t pmatch[3];         // Up to 3 sub-expressions
	
	rv = regcomp(&regex, NUMERIC_MASK, REG_EXTENDED | REG_ICASE | REG_NEWLINE);
	if (rv) {
		return 0;
	}

	/* printf("input '%s'\n", input); */
	deb = deblank(input);
	
	/* printf("deb '%s'\n", deb); */
	rv = regexec(&regex, deb, ARRAY_SIZE (pmatch), pmatch, 0);
	
	if (rv) {
		return 0;
	}
	
	result = (int)
		(strlen(deb) == (size_t)(pmatch[0].rm_eo - pmatch[0].rm_so));
	
	regfree(&regex);
	free(deb);
	
	/* Normal function termination */
	return result; 
}